

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O2

ErrorNumber callWithDefaults(char *funcName,double *input,int *input_int,int size)

{
  TA_InputParameterType TVar1;
  uint uVar2;
  TA_RetCode TVar3;
  ErrorNumber EVar4;
  TA_Real *volume;
  long lVar5;
  TA_Real *high;
  TA_Real *open;
  uint uVar6;
  uint uVar7;
  TA_Real *low;
  TA_Real *close;
  int (*paiVar8) [2000];
  double (*padVar9) [2000];
  ulong uVar10;
  undefined1 auVar11 [16];
  TA_ParamHolder *paramHolder;
  int outBegIdx;
  TA_FuncHandle *handle;
  int local_54;
  int lookback;
  int outNbElement;
  TA_FuncInfo *funcInfo;
  TA_OutputParameterInfo *outputInfo;
  TA_InputParameterInfo *inputInfo;
  
  TVar3 = TA_GetFuncHandle(funcName,&handle);
  if (TVar3 == TA_SUCCESS) {
    TVar3 = TA_ParamHolderAlloc(handle,&paramHolder);
    if (TVar3 == TA_SUCCESS) {
      TA_GetFuncInfo(handle,&funcInfo);
      for (uVar6 = 0; uVar6 < funcInfo->nbInput; uVar6 = uVar6 + 1) {
        uVar7 = uVar6;
        TA_GetInputParameterInfo(handle,uVar6,&inputInfo);
        TVar1 = inputInfo->type;
        if (TVar1 == TA_Input_Integer) {
          TA_SetInputParamIntegerPtr(paramHolder,uVar6,input_int);
        }
        else if (TVar1 == TA_Input_Real) {
          TA_SetInputParamRealPtr(paramHolder,uVar6,input);
        }
        else if (TVar1 == TA_Input_Price) {
          uVar2 = inputInfo->flags;
          open = (TA_Real *)0x0;
          if ((uVar2 & 1) != 0) {
            open = input;
          }
          auVar11._0_4_ = -(uint)((uVar2 & 0x10) == 0);
          auVar11._4_4_ = -(uint)((uVar2 & 8) == 0);
          auVar11._8_4_ = -(uint)((uVar2 & 4) == 0);
          auVar11._12_4_ = -(uint)((uVar2 & 2) == 0);
          uVar7 = movmskps(uVar7,auVar11);
          high = (TA_Real *)0x0;
          if ((uVar7 & 8) == 0) {
            high = input;
          }
          low = (TA_Real *)0x0;
          if ((uVar7 & 4) == 0) {
            low = input;
          }
          close = (TA_Real *)0x0;
          if ((uVar7 & 2) == 0) {
            close = input;
          }
          volume = (TA_Real *)0x0;
          if ((uVar7 & 1) == 0) {
            volume = input;
          }
          TA_SetInputParamPricePtr(paramHolder,uVar6,open,high,low,close,volume,(TA_Real *)0x0);
        }
      }
      paiVar8 = output_int;
      padVar9 = output;
      local_54 = size;
      for (uVar10 = 0; uVar10 < funcInfo->nbOutput; uVar10 = uVar10 + 1) {
        uVar6 = (uint)uVar10;
        TA_GetOutputParameterInfo(handle,uVar6,&outputInfo);
        if (outputInfo->type == TA_Output_Integer) {
          TA_SetOutputParamIntegerPtr(paramHolder,uVar6,output_int[uVar10]);
          for (lVar5 = 0; lVar5 != 2000; lVar5 = lVar5 + 1) {
            (*paiVar8)[lVar5] = -0x7fffffff;
          }
        }
        else if (outputInfo->type == TA_Output_Real) {
          TA_SetOutputParamRealPtr(paramHolder,uVar6,output[uVar10]);
          for (lVar5 = 0; lVar5 != 2000; lVar5 = lVar5 + 1) {
            (*padVar9)[lVar5] = -3e+37;
          }
        }
        paiVar8 = paiVar8 + 1;
        padVar9 = padVar9 + 1;
      }
      TVar3 = TA_CallFunc(paramHolder,0,local_54 + -1,&outBegIdx,&outNbElement);
      if (TVar3 == TA_SUCCESS) {
        TVar3 = TA_GetLookback(paramHolder,&lookback);
        if (TVar3 == TA_SUCCESS) {
          if (outBegIdx == lookback) {
            TVar3 = TA_CallFunc(paramHolder,0,0,&outBegIdx,&outNbElement);
            if (TVar3 == TA_SUCCESS) {
              if (outBegIdx == 0) {
                TVar3 = TA_ParamHolderFree(paramHolder);
                if (TVar3 == TA_SUCCESS) {
                  EVar4 = TA_TEST_PASS;
                }
                else {
                  printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar3);
                  EVar4 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
                }
              }
              else {
                printf("failed outBegIdx=%d when startIdx==endIdx==0\n");
                TA_ParamHolderFree(paramHolder);
                EVar4 = TA_ABS_TST_FAIL_STARTEND_ZERO;
              }
            }
            else {
              printf("TA_CallFunc() failed data test 4 [%d]\n",(ulong)TVar3);
              TA_ParamHolderFree(paramHolder);
              EVar4 = TA_ABS_TST_FAIL_CALLFUNC_4;
            }
          }
          else {
            printf("TA_GetLookback() != outBegIdx [%d != %d]\n");
            TA_ParamHolderFree(paramHolder);
            EVar4 = TA_ABS_TST_FAIL_CALLFUNC_3;
          }
        }
        else {
          printf("TA_GetLookback() failed zero data test [%d]\n",(ulong)TVar3);
          TA_ParamHolderFree(paramHolder);
          EVar4 = TA_ABS_TST_FAIL_CALLFUNC_2;
        }
      }
      else {
        printf("TA_CallFunc() failed zero data test [%d]\n",(ulong)TVar3);
        TA_ParamHolderFree(paramHolder);
        EVar4 = TA_ABS_TST_FAIL_CALLFUNC_1;
      }
    }
    else {
      printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar3);
      EVar4 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
    }
  }
  else {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar3);
    EVar4 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  return EVar4;
}

Assistant:

static ErrorNumber callWithDefaults( const char *funcName, const double *input, const int *input_int, int size )
{
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo *inputInfo;
   const TA_OutputParameterInfo *outputInfo;

   TA_RetCode retCode;
   unsigned int i;
   int j;
   int outBegIdx, outNbElement, lookback;

   retCode = TA_GetFuncHandle( funcName, &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   TA_GetFuncInfo( handle, &funcInfo );

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      TA_GetInputParameterInfo( handle, i, &inputInfo );
	  switch(inputInfo->type)
	  {
	  case TA_Input_Price:
         TA_SetInputParamPricePtr( paramHolder, i,
			 inputInfo->flags&TA_IN_PRICE_OPEN?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_HIGH?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_LOW?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_CLOSE?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_VOLUME?input:NULL, NULL );
		 break;
	  case TA_Input_Real:
         TA_SetInputParamRealPtr( paramHolder, i, input );
		 break;
	  case TA_Input_Integer:
         TA_SetInputParamIntegerPtr( paramHolder, i, input_int );
         break;
	  }
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      TA_GetOutputParameterInfo( handle, i, &outputInfo );
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
	     TA_SetOutputParamRealPtr(paramHolder,i,&output[i][0]);
         for( j=0; j < 2000; j++ )
            output[i][j] = TA_REAL_MIN;
		 break;
	  case TA_Output_Integer:
	     TA_SetOutputParamIntegerPtr(paramHolder,i,&output_int[i][0]);
         for( j=0; j < 2000; j++ )
            output_int[i][j] = TA_INTEGER_MIN;
		 break;
	  }
   }

   /* Do the function call. */
   retCode = TA_CallFunc(paramHolder,0,size-1,&outBegIdx,&outNbElement);
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_CallFunc() failed zero data test [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_1;
   }

   /* Verify consistency with Lookback */
   retCode = TA_GetLookback( paramHolder, &lookback );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_GetLookback() failed zero data test [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_2;
   }

   if( outBegIdx != lookback )
   {
      printf( "TA_GetLookback() != outBegIdx [%d != %d]\n", lookback, outBegIdx );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_3;
   }

   /* TODO Add back nan/inf tests.
   for( i=0; i < funcInfo->nbOutput; i++ )
   {
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
		for( j=0; j < outNbElement; j++ )
		{
			if( trio_isnan(output[i][j]) ||
                trio_isinf(output[i][j]))
			{
				printf( "Failed for output[%d][%d] = %e\n", i, j, output[i][j] );
				return TA_ABS_TST_FAIL_INVALID_OUTPUT;
			}
		}
		break;
	  case TA_Output_Integer:
		break;
	  }
   }*/

   /* Do another function call where startIdx == endIdx == 0.
    * In that case, outBegIdx should ALWAYS be zero.
    */
   retCode = TA_CallFunc(paramHolder,0,0,&outBegIdx,&outNbElement);
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_CallFunc() failed data test 4 [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_4;
   }

   if( outBegIdx != 0 )
   {
      printf( "failed outBegIdx=%d when startIdx==endIdx==0\n", outBegIdx );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_STARTEND_ZERO;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   return TA_TEST_PASS;
}